

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_seq_flow(Parser *this)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  undefined1 uVar13;
  int iVar14;
  State *pSVar15;
  uint uVar16;
  char *pcVar17;
  csubstr fmt;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  csubstr cVar18;
  size_t sStackY_1c0;
  bool is_quoted;
  csubstr local_188;
  char msg [31];
  char *pcStack_118;
  size_t local_110;
  char *pcStack_f0;
  size_t local_e8;
  char *pcStack_c8;
  size_t local_c0;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_28;
  size_t local_20;
  
  pSVar15 = this->m_state;
  local_188.str = (pSVar15->line_contents).rem.str;
  local_188.len = (pSVar15->line_contents).rem.len;
  uVar16 = pSVar15->flags;
  if ((uVar16 & 0x40) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(RKEY))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar3 = (code *)swi(3);
      uVar13 = (*pcVar3)();
      return (bool)uVar13;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_20 = cVar18.len;
    pcStack_28 = cVar18.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6d80) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6d80) << 0x40,8);
    LVar4.name.str = pcStack_28;
    LVar4.name.len = local_20;
    (*p_Var2)(msg,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
    uVar16 = this->m_state->flags;
  }
  if ((~uVar16 & 0x18) != 0) {
    builtin_strncpy(msg,"check failed: (has_all(RSEQ|FLO",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar3 = (code *)swi(3);
      uVar13 = (*pcVar3)();
      return (bool)uVar13;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar18 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_48 = cVar18.len;
    pcStack_50 = cVar18.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6d81) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6d81) << 0x40,8);
    LVar5.name.str = pcStack_50;
    LVar5.name.len = local_48;
    (*p_Var2)(msg,0x23,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if (local_188.len != 0) {
    cVar1 = *local_188.str;
    if (cVar1 == ']') {
      _pop_level(this);
      _line_progressed(this,1);
      if ((this->m_state->flags & 0x2000) != 0) {
        _stop_seqimap(this);
        _pop_level(this);
        return true;
      }
      return true;
    }
    if (cVar1 == '#') {
      _scan_comment(this);
      return true;
    }
    if (cVar1 != ' ') goto LAB_001c0b70;
    pSVar15 = this->m_state;
    if (((pSVar15->line_contents).rem.len == 0) || (*(pSVar15->line_contents).rem.str != ' ')) {
      builtin_strncpy(msg,"check failed: (m_state->line_co",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar3 = (code *)swi(3);
        uVar13 = (*pcVar3)();
        return (bool)uVar13;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar18 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_110 = cVar18.len;
      pcStack_118 = cVar18.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
      LVar6.name.str = pcStack_118;
      LVar6.name.len = local_110;
      (*p_Var2)(msg,0x3a,LVar6,(this->m_stack).m_callbacks.m_user_data);
      pSVar15 = this->m_state;
    }
    cVar1 = ' ';
LAB_001c0b49:
    sStackY_1c0 = basic_substring<const_char>::first_not_of(&(pSVar15->line_contents).rem,cVar1,0);
    if (sStackY_1c0 == 0xffffffffffffffff) {
      sStackY_1c0 = (this->m_state->line_contents).rem.len;
    }
    goto LAB_001c1109;
  }
LAB_001c0b70:
  uVar16 = this->m_state->flags;
  if ((char)uVar16 < '\0') {
    if ((uVar16 >> 8 & 1) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RNXT))",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar3 = (code *)swi(3);
        uVar13 = (*pcVar3)();
        return (bool)uVar13;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar18 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_70 = cVar18.len;
      pcStack_78 = cVar18.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6da5) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6da5) << 0x40,8);
      LVar7.name.str = pcStack_78;
      LVar7.name.len = local_70;
      (*p_Var2)(msg,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar12 = _scan_scalar_seq_flow(this,&local_188,&is_quoted);
    if (bVar12) {
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      cVar18.len = local_188.len;
      cVar18.str = local_188.str;
      _append_val(this,cVar18,(uint)is_quoted);
      return true;
    }
    if (local_188.len == 0) {
LAB_001c0e39:
      iVar14 = basic_substring<const_char>::compare(&local_188,':');
      if (iVar14 != 0) {
        pattern_00.len = 2;
        pattern_00.str = ": ";
        bVar12 = basic_substring<const_char>::begins_with(&local_188,pattern_00);
        if (bVar12) {
LAB_001c10ad:
          _start_seqimap(this);
        }
        else {
          pattern_01.len = 2;
          pattern_01.str = "? ";
          bVar12 = basic_substring<const_char>::begins_with(&local_188,pattern_01);
          if (bVar12) {
            _start_seqimap(this);
            _line_progressed(this,2);
            pSVar15 = this->m_state;
            uVar16 = pSVar15->flags;
            if (((uVar16 >> 9 & 1) == 0) ||
               (iVar14 = basic_substring<const_char>::compare(&pSVar15->scalar,"",0), iVar14 != 0))
            {
              builtin_strncpy(msg,"check failed: (has_any(SSCL) &&",0x1f);
              if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
                pcVar3 = (code *)swi(3);
                uVar13 = (*pcVar3)();
                return (bool)uVar13;
              }
              p_Var2 = (this->m_stack).m_callbacks.m_error;
              cVar18 = to_csubstr(
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 );
              local_98 = cVar18.len;
              pcStack_a0 = cVar18.str;
              LVar9.super_LineCol.col = 0;
              LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6dd5) << 0x40,0);
              LVar9.super_LineCol.line = SUB168(ZEXT816(0x6dd5) << 0x40,8);
              LVar9.name.str = pcStack_a0;
              LVar9.name.len = local_98;
              (*p_Var2)(msg,0x37,LVar9,(this->m_stack).m_callbacks.m_user_data);
              pSVar15 = this->m_state;
              uVar16 = pSVar15->flags;
            }
            pSVar15->flags = uVar16 & 0xfffffd1f | 0x60;
            return true;
          }
          bVar12 = _handle_types(this);
          if (bVar12) {
            return true;
          }
          bVar12 = _handle_val_anchors_and_refs(this);
          if (bVar12) {
            return true;
          }
          pattern_03.len = 2;
          pattern_03.str = ", ";
          bVar12 = basic_substring<const_char>::begins_with(&local_188,pattern_03);
          if (!bVar12) {
            if (local_188.len != 0) {
              if (*local_188.str == '\t') {
                pSVar15 = this->m_state;
                if (((pSVar15->line_contents).rem.len == 0) ||
                   (*(pSVar15->line_contents).rem.str != '\t')) {
                  builtin_strncpy(msg,"check failed: (m_state->line_co",0x1f);
                  if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12))
                  {
                    pcVar3 = (code *)swi(3);
                    uVar13 = (*pcVar3)();
                    return (bool)uVar13;
                  }
                  p_Var2 = (this->m_stack).m_callbacks.m_error;
                  cVar18 = to_csubstr(
                                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                     );
                  local_110 = cVar18.len;
                  pcStack_118 = cVar18.str;
                  LVar11.super_LineCol.col = 0;
                  LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
                  LVar11.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
                  LVar11.name.str = pcStack_118;
                  LVar11.name.len = local_110;
                  (*p_Var2)(msg,0x3a,LVar11,(this->m_stack).m_callbacks.m_user_data);
                  pSVar15 = this->m_state;
                }
                cVar1 = '\t';
                goto LAB_001c0b49;
              }
              if (*local_188.str == ',') {
                _append_val_null(this,local_188.str + -1);
                goto LAB_001c1103;
              }
            }
            bVar12 = is_debugger_attached();
            if ((bVar12) && (bVar12 = is_debugger_attached(), bVar12)) {
              pcVar3 = (code *)swi(3);
              uVar13 = (*pcVar3)();
              return (bool)uVar13;
            }
            pcVar17 = "ERROR: parse error";
            sStackY_1c0 = 0x12;
LAB_001c0ba3:
            fmt.len = sStackY_1c0;
            fmt.str = pcVar17;
            _err<>(this,fmt);
            return true;
          }
          _append_val_null(this,local_188.str + -1);
        }
LAB_001c10b5:
        sStackY_1c0 = 2;
        goto LAB_001c1109;
      }
      goto LAB_001c10b9;
    }
    if (*local_188.str == '{') {
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_map(this,true);
      pSVar15 = this->m_state;
      uVar16 = pSVar15->flags & 0xffffff2fU | 0x50;
LAB_001c1101:
      pSVar15->flags = uVar16;
    }
    else {
      if (*local_188.str != '[') goto LAB_001c0e39;
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_seq(this,true);
      this->m_state->flags = this->m_state->flags | 0x10;
    }
  }
  else {
    if ((uVar16 >> 8 & 1) == 0) {
      bVar12 = is_debugger_attached();
      if ((bVar12) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar3 = (code *)swi(3);
        uVar13 = (*pcVar3)();
        return (bool)uVar13;
      }
      pcVar17 = "ERROR: internal error";
      sStackY_1c0 = 0x15;
      goto LAB_001c0ba3;
    }
    pattern.len = 2;
    pattern.str = ", ";
    bVar12 = basic_substring<const_char>::begins_with(&local_188,pattern);
    if (bVar12) {
      pSVar15 = this->m_state;
      uVar16 = pSVar15->flags;
      if ((uVar16 & 0x10) == 0) {
        builtin_strncpy(msg,"check failed: (has_all(FLOW))",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar3 = (code *)swi(3);
          uVar13 = (*pcVar3)();
          return (bool)uVar13;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar18 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_c0 = cVar18.len;
        pcStack_c8 = cVar18.str;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6dfe) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x6dfe) << 0x40,8);
        LVar8.name.str = pcStack_c8;
        LVar8.name.len = local_c0;
        (*p_Var2)(msg,0x1e,LVar8,(this->m_stack).m_callbacks.m_user_data);
        pSVar15 = this->m_state;
        uVar16 = pSVar15->flags;
      }
      pSVar15->flags = uVar16 & 0xfffffe7f | 0x80;
      goto LAB_001c10b5;
    }
    if ((local_188.len != 0) && (*local_188.str == ',')) {
      pSVar15 = this->m_state;
      uVar16 = pSVar15->flags;
      if ((uVar16 & 0x10) == 0) {
        builtin_strncpy(msg,"check failed: (has_all(FLOW))",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar3 = (code *)swi(3);
          uVar13 = (*pcVar3)();
          return (bool)uVar13;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar18 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_e8 = cVar18.len;
        pcStack_f0 = cVar18.str;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6e06) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x6e06) << 0x40,8);
        LVar10.name.str = pcStack_f0;
        LVar10.name.len = local_e8;
        (*p_Var2)(msg,0x1e,LVar10,(this->m_stack).m_callbacks.m_user_data);
        pSVar15 = this->m_state;
        uVar16 = pSVar15->flags;
      }
      uVar16 = uVar16 & 0xfffffe7f | 0x80;
      goto LAB_001c1101;
    }
    iVar14 = basic_substring<const_char>::compare(&local_188,':');
    if (iVar14 != 0) {
      pattern_02.len = 2;
      pattern_02.str = ": ";
      bVar12 = basic_substring<const_char>::begins_with(&local_188,pattern_02);
      if (!bVar12) {
        bVar12 = is_debugger_attached();
        if ((bVar12) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar3 = (code *)swi(3);
          uVar13 = (*pcVar3)();
          return (bool)uVar13;
        }
        pcVar17 = "ERROR: was expecting a comma";
        sStackY_1c0 = 0x1c;
        goto LAB_001c0ba3;
      }
      goto LAB_001c10ad;
    }
LAB_001c10b9:
    _start_seqimap(this);
  }
LAB_001c1103:
  sStackY_1c0 = 1;
LAB_001c1109:
  _line_progressed(this,sStackY_1c0);
  return true;
}

Assistant:

bool Parser::_handle_seq_flow()
{
    _c4dbgpf("handle_seq_flow: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with(']'))
    {
        _c4dbgp("end the sequence");
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        bool is_quoted;
        if(_scan_scalar_seq_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL);
            _append_val(rem, is_quoted);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgpf("found '? ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(SSCL) && m_state->scalar == "");
            addrem_flags(QMRK|RKEY, RVAL|SSCL);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(", "))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('\t'))
        {
            _skipchars('\t');
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        if(rem.begins_with(", "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else
        {
            _c4err("was expecting a comma");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return true;
}